

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupDemiter(Gia_Man_t *p,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  char *pcVar4;
  int iVar5;
  Vec_Int_t *vSuper;
  int *piVar6;
  uint *__ptr;
  void *pvVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  int iVar14;
  size_t sVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  size_t sVar19;
  size_t sVar20;
  long lVar21;
  
  iVar5 = p->vCos->nSize;
  if (iVar5 - p->nRegs != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x1088,"Gia_Man_t *Gia_ManDupDemiter(Gia_Man_t *, int)");
  }
  if (iVar5 < 1) {
LAB_001f42be:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar5 = *p->vCos->pArray;
  if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
LAB_001f4242:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar1 = p->pObjs + iVar5;
  vSuper = (Vec_Int_t *)malloc(0x10);
  vSuper->nCap = 100;
  vSuper->nSize = 0;
  piVar6 = (int *)malloc(400);
  vSuper->pArray = piVar6;
  Gia_ManDupWithConstrCollectAnd_rec
            (p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),vSuper,1);
  uVar12 = vSuper->nSize;
  sVar19 = (size_t)(int)uVar12;
  if ((long)sVar19 < 2) {
    __assert_fail("Vec_IntSize(vSuper) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x108d,"Gia_Man_t *Gia_ManDupDemiter(Gia_Man_t *, int)");
  }
  pcVar4 = "LOR";
  if ((*(uint *)pGVar1 >> 0x1d & 1) == 0) {
    pcVar4 = "LAND";
  }
  sVar15 = 0;
  printf("The miter is %s-decomposable into %d parts.\n",pcVar4 + 1,(ulong)uVar12);
  Gia_ManLevelNum(p);
  piVar6 = vSuper->pArray;
  do {
    if (piVar6[sVar15] < 0) goto LAB_001f4280;
    uVar17 = (uint)piVar6[sVar15] >> 1;
    pVVar9 = p->vLevels;
    Vec_IntFillExtra(pVVar9,uVar17 + 1,0);
    if (pVVar9->nSize <= (int)uVar17) goto LAB_001f42be;
    if (p->nObjs <= (int)uVar17) goto LAB_001f4242;
    p->pObjs[uVar17].Value = pVVar9->pArray[uVar17];
    sVar15 = sVar15 + 1;
  } while (sVar19 != sVar15);
  __ptr = (uint *)malloc(0x10);
  uVar18 = 8;
  if (8 < uVar12) {
    uVar18 = (ulong)uVar12;
  }
  __ptr[1] = 0;
  pvVar7 = malloc(uVar18 * 8);
  *(void **)(__ptr + 2) = pvVar7;
  sVar15 = 0;
  do {
    sVar20 = sVar15;
    uVar12 = vSuper->pArray[sVar20];
    if ((int)uVar12 < 0) {
LAB_001f4280:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (p->nObjs <= (int)(uVar12 >> 1)) goto LAB_001f4242;
    pGVar3 = p->pObjs;
    iVar5 = (int)uVar18;
    if ((int)sVar20 == iVar5) {
      if (iVar5 < 0x10) {
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar7 = malloc(0x80);
        }
        else {
          pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
        }
        *(void **)(__ptr + 2) = pvVar7;
        *__ptr = 0x10;
        uVar18 = 0x10;
      }
      else {
        uVar18 = (ulong)(uint)(iVar5 * 2);
        if (*(void **)(__ptr + 2) == (void *)0x0) {
          pvVar7 = malloc(uVar18 * 8);
        }
        else {
          pvVar7 = realloc(*(void **)(__ptr + 2),uVar18 * 8);
        }
        *(void **)(__ptr + 2) = pvVar7;
        *__ptr = iVar5 * 2;
      }
    }
    else {
      pvVar7 = *(void **)(__ptr + 2);
    }
    sVar15 = sVar20 + 1;
    __ptr[1] = (uint)sVar15;
    *(ulong *)((long)pvVar7 + sVar20 * 8) = (ulong)(pGVar3 + (uVar12 >> 1)) ^ (ulong)(uVar12 & 1);
  } while (sVar19 != sVar15);
  if ((uint)sVar15 != 1) {
    qsort(*(void **)(__ptr + 2),sVar15,8,Gia_ManSortByValue);
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar19 = strlen(pcVar4);
    pcVar8 = (char *)malloc(sVar19 + 1);
    strcpy(pcVar8,pcVar4);
  }
  p_00->pName = pcVar8;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar19 = strlen(pcVar4);
    pcVar8 = (char *)malloc(sVar19 + 1);
    strcpy(pcVar8,pcVar4);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar16 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar16];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_001f4242;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar18 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar13 = p_00->pObjs;
      if ((pGVar10 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar10)) goto LAB_001f4261;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * -0x55555555);
      pGVar13 = p_00->pObjs;
      if ((pGVar10 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar10)) goto LAB_001f4261;
      pGVar3[iVar5].Value = (int)((ulong)((long)pGVar10 - (long)pGVar13) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
      pVVar9 = p->vCis;
    } while (lVar16 < pVVar9->nSize);
  }
  iVar5 = p->nObjs;
  if (0 < iVar5) {
    lVar16 = 8;
    lVar21 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar18 = *(ulong *)((long)pGVar3 + lVar16 + -8);
      if ((uVar18 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar18) {
        uVar12 = *(uint *)((long)pGVar3 +
                          lVar16 + (ulong)(uint)((int)(uVar18 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar17 = *(uint *)((long)pGVar3 +
                              lVar16 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar17 < 0)) goto LAB_001f429f;
        iVar5 = Gia_ManHashAnd(p_00,uVar12 ^ (uint)(uVar18 >> 0x1d) & 1,
                               uVar17 ^ (uint)(uVar18 >> 0x3d) & 1);
        *(int *)(&pGVar3->field_0x0 + lVar16) = iVar5;
        iVar5 = p->nObjs;
      }
      lVar21 = lVar21 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar21 < iVar5);
  }
  lVar16 = *(long *)(__ptr + 2);
  sVar19 = 0xffffffffffffffff;
  do {
    uVar18 = *(ulong *)(lVar16 + 8 + sVar19 * 8);
    pGVar13 = (Gia_Obj_t *)(uVar18 & 0xfffffffffffffffe);
    pGVar3 = p->pObjs;
    if ((pGVar13 < pGVar3) || (pGVar3 + p->nObjs <= pGVar13)) {
LAB_001f4261:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar12 = (int)((long)pGVar13 - (long)pGVar3 >> 2) * -0x55555555;
    if ((int)uVar12 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    if (p->nObjs <= (int)uVar12) goto LAB_001f4242;
    if ((int)pGVar3[uVar12 & 0x7fffffff].Value < 0) goto LAB_001f429f;
    Gia_ManAppendCo(p_00,(*(uint *)pGVar1 >> 0x1d ^ (uint)uVar18) & 1 ^
                         pGVar3[uVar12 & 0x7fffffff].Value);
    sVar19 = sVar19 + 1;
  } while (sVar20 != sVar19);
  iVar5 = p->nRegs;
  if (0 < iVar5) {
    iVar14 = 0;
    do {
      iVar2 = p->vCos->nSize;
      uVar12 = (iVar2 - iVar5) + iVar14;
      if (((int)uVar12 < 0) || (iVar2 <= (int)uVar12)) goto LAB_001f42be;
      iVar2 = p->vCos->pArray[uVar12];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_001f4242;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      uVar17 = (uint)*(undefined8 *)pGVar1;
      uVar12 = pGVar1[-(ulong)(uVar17 & 0x1fffffff)].Value;
      if ((int)uVar12 < 0) {
LAB_001f429f:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_00,uVar17 >> 0x1d & 1 ^ uVar12);
      iVar14 = iVar14 + 1;
      iVar5 = p->nRegs;
    } while (iVar14 < iVar5);
  }
  Gia_ManSetRegNum(p_00,iVar5);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  if (vSuper->pArray != (int *)0x0) {
    free(vSuper->pArray);
  }
  free(vSuper);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManDupDemiter( Gia_Man_t * p, int fVerbose )
{
    Vec_Int_t * vSuper;
    Vec_Ptr_t * vSuperPtr;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjPo;
    int i, iLit;
    assert( Gia_ManPoNum(p) == 1 );
    // decompose
    pObjPo = Gia_ManPo( p, 0 );
    vSuper = Vec_IntAlloc( 100 );
    Gia_ManDupWithConstrCollectAnd_rec( p, Gia_ObjFanin0(pObjPo), vSuper, 1 );
    assert( Vec_IntSize(vSuper) > 1 );
    // report the result
    printf( "The miter is %s-decomposable into %d parts.\n", Gia_ObjFaninC0(pObjPo) ? "OR":"AND", Vec_IntSize(vSuper) );
    // create levels
    Gia_ManLevelNum( p );
    Vec_IntForEachEntry( vSuper, iLit, i )
        Gia_ManObj(p, Abc_Lit2Var(iLit))->Value = Gia_ObjLevelId(p, Abc_Lit2Var(iLit));
    // create pointer array
    vSuperPtr = Vec_PtrAlloc( Vec_IntSize(vSuper) );
    Vec_IntForEachEntry( vSuper, iLit, i )
        Vec_PtrPush( vSuperPtr, Gia_Lit2Obj(p, iLit) );
    Vec_PtrSort( vSuperPtr, (int (*)(void))Gia_ManSortByValue );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create the outputs
    Vec_PtrForEachEntry( Gia_Obj_t *, vSuperPtr, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjLitCopy(p, Gia_Obj2Lit(p, pObj)) ^ Gia_ObjFaninC0(pObjPo) );
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // rehash
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vSuper );
    Vec_PtrFree( vSuperPtr );
    return pNew;
}